

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liblocate.c
# Opt level: O1

void libPrefix(char **prefix,uint *prefixLength)

{
  uchar uVar1;
  
  uVar1 = checkStringOutParameter(prefix,prefixLength);
  if (uVar1 != '\0') {
    copyToStringOutParameter("lib",3,prefix,prefixLength);
    return;
  }
  return;
}

Assistant:

void libPrefix(char ** prefix, unsigned int * prefixLength)
{
    // Early exit when invalid out-parameters are passed
    if (!checkStringOutParameter(prefix, prefixLength))
    {
        return;
    }

#if defined SYSTEM_WINDOWS || defined SYSTEM_DARWIN
    copyToStringOutParameter("", 0, prefix, prefixLength);
#else
    copyToStringOutParameter("lib", 3, prefix, prefixLength);
#endif
}